

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O0

void __thiscall
TPZBlockDiagonal<double>::TPZBlockDiagonal
          (TPZBlockDiagonal<double> *this,TPZVec<int> *blocksizes,TPZFMatrix<double> *glob)

{
  int iVar1;
  long lVar2;
  double dVar3;
  int64_t iVar4;
  int *piVar5;
  long *plVar6;
  double *pdVar7;
  long *in_RDX;
  TPZVec<int> *in_RSI;
  TPZRegisterClassId *in_RDI;
  int64_t c;
  int64_t r;
  int64_t eq;
  int64_t pos;
  int bsize;
  int64_t neq;
  int64_t ndata;
  int64_t b;
  int64_t nblock;
  TPZVec<int> *in_stack_ffffffffffffff18;
  TPZVec<int> *in_stack_ffffffffffffff20;
  double *in_stack_ffffffffffffff30;
  long *in_stack_ffffffffffffff38;
  TPZVec<double> *in_stack_ffffffffffffff40;
  long local_90;
  long local_88;
  long local_80;
  long local_60;
  int64_t local_50;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZBlockDiagonal<double>>(in_RDI,0x21);
  *(undefined8 *)(in_RDI + 10) = 0;
  *(undefined8 *)(in_RDI + 0x12) = 0;
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  TPZMatrix<double>::TPZMatrix
            ((TPZMatrix<double> *)in_stack_ffffffffffffff20,&in_stack_ffffffffffffff18->_vptr_TPZVec
            );
  *(undefined ***)in_RDI = &PTR__TPZBlockDiagonal_023f0d28;
  TPZVec<double>::TPZVec((TPZVec<double> *)(in_RDI + 0x20));
  TPZVec<long>::TPZVec((TPZVec<long> *)(in_RDI + 0x40));
  TPZVec<int>::TPZVec(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  iVar4 = TPZVec<int>::NElements(in_RSI);
  TPZVec<long>::Resize
            ((TPZVec<long> *)in_stack_ffffffffffffff40,(int64_t)in_stack_ffffffffffffff38,
             (long *)in_stack_ffffffffffffff30);
  local_60 = 0;
  for (local_50 = 0; local_50 < iVar4; local_50 = local_50 + 1) {
    in_stack_ffffffffffffff40 = (TPZVec<double> *)TPZVec<int>::operator[](in_RSI,local_50);
    iVar1 = *(int *)&in_stack_ffffffffffffff40->_vptr_TPZVec;
    in_stack_ffffffffffffff38 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x40),local_50);
    lVar2 = *in_stack_ffffffffffffff38;
    in_stack_ffffffffffffff30 =
         (double *)TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x40),local_50 + 1);
    *in_stack_ffffffffffffff30 = (double)(lVar2 + (ulong)(uint)(iVar1 * iVar1));
    local_60 = iVar1 + local_60;
  }
  TPZVec<double>::Resize
            (in_stack_ffffffffffffff40,(int64_t)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30)
  ;
  *(long *)(in_RDI + 8) = local_60;
  *(long *)(in_RDI + 0x10) = local_60;
  local_80 = 0;
  for (local_50 = 0; local_50 < iVar4; local_50 = local_50 + 1) {
    piVar5 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x60),local_50);
    iVar1 = *piVar5;
    plVar6 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x40),local_50);
    lVar2 = *plVar6;
    for (local_88 = 0; local_88 < iVar1; local_88 = local_88 + 1) {
      for (local_90 = 0; local_90 < iVar1; local_90 = local_90 + 1) {
        dVar3 = (double)(**(code **)(*in_RDX + 0x120))
                                  (in_RDX,local_80 + local_88,local_80 + local_90);
        pdVar7 = TPZVec<double>::operator[]
                           ((TPZVec<double> *)(in_RDI + 0x20),lVar2 + local_88 + iVar1 * local_90);
        *pdVar7 = dVar3;
      }
    }
    local_80 = iVar1 + local_80;
  }
  return;
}

Assistant:

TPZBlockDiagonal<TVar>::TPZBlockDiagonal(const TPZVec<int> &blocksizes, const TPZFMatrix<TVar> &glob)
: TPZRegisterClassId(&TPZBlockDiagonal::ClassId),
TPZMatrix<TVar>(), fBlockSize(blocksizes)
{
	int64_t nblock = blocksizes.NElements();
	fBlockPos.Resize(nblock+1,0);
	int64_t b;
	int64_t ndata = 0;
	int64_t neq = 0;
	int bsize;
	for(b=0; b<nblock; b++) {
		bsize = blocksizes[b];
		fBlockPos[b+1] = fBlockPos[b]+bsize*bsize;
		ndata += bsize*bsize;
		neq += bsize;
	}
	fStorage.Resize(ndata,0.);
	this->fRow = neq;
	this->fCol = neq;
	int64_t pos;
	int64_t eq = 0, r, c;
	for(b=0; b<nblock; b++) {
		bsize = fBlockSize[b];
		pos = fBlockPos[b];
		for(r=0; r<bsize; r++) {
			for(c=0; c<bsize; c++) {
				fStorage[pos+r+bsize*c]= glob.GetVal(eq+r,eq+c);
			}
		}
		eq += bsize;
	}
	
}